

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  uint uVar24;
  byte unaff_BPL;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i match;
  ulong local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar25 = hashval >> 7 & uVar2;
  auVar28 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar28 = pshuflw(auVar28,auVar28,0);
  local_68 = 0;
  do {
    pcVar1 = this->ctrl_ + uVar25;
    cVar7 = *pcVar1;
    cVar8 = pcVar1[1];
    cVar9 = pcVar1[2];
    cVar10 = pcVar1[3];
    cVar11 = pcVar1[4];
    cVar12 = pcVar1[5];
    cVar13 = pcVar1[6];
    cVar14 = pcVar1[7];
    cVar15 = pcVar1[8];
    cVar16 = pcVar1[9];
    cVar17 = pcVar1[10];
    cVar18 = pcVar1[0xb];
    cVar19 = pcVar1[0xc];
    cVar20 = pcVar1[0xd];
    cVar21 = pcVar1[0xe];
    cVar22 = pcVar1[0xf];
    local_58 = auVar28[0];
    cStack_57 = auVar28[1];
    cStack_56 = auVar28[2];
    cStack_55 = auVar28[3];
    auVar29[0] = -(local_58 == cVar7);
    auVar29[1] = -(cStack_57 == cVar8);
    auVar29[2] = -(cStack_56 == cVar9);
    auVar29[3] = -(cStack_55 == cVar10);
    auVar29[4] = -(local_58 == cVar11);
    auVar29[5] = -(cStack_57 == cVar12);
    auVar29[6] = -(cStack_56 == cVar13);
    auVar29[7] = -(cStack_55 == cVar14);
    auVar29[8] = -(local_58 == cVar15);
    auVar29[9] = -(cStack_57 == cVar16);
    auVar29[10] = -(cStack_56 == cVar17);
    auVar29[0xb] = -(cStack_55 == cVar18);
    auVar29[0xc] = -(local_58 == cVar19);
    auVar29[0xd] = -(cStack_57 == cVar20);
    auVar29[0xe] = -(cStack_56 == cVar21);
    auVar29[0xf] = -(cStack_55 == cVar22);
    uVar6 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
    bVar26 = uVar6 == 0;
    if (!bVar26) {
      uVar24 = (uint)uVar6;
      do {
        uVar5 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        ppVar3 = this->slots_[uVar5 + uVar25 & uVar2].mDat;
        ppVar4 = elem->mDat;
        bVar27 = ppVar3 == (proxy *)0x0 && ppVar4 == (proxy *)0x0;
        if (ppVar4 != (proxy *)0x0 && ppVar3 != (proxy *)0x0) {
          iVar23 = (*ppVar3->data->_vptr_baseHolder[4])(ppVar3->data,ppVar4->data);
          bVar27 = (byte)iVar23;
        }
        unaff_BPL = unaff_BPL | bVar27;
        if (bVar27 != 0) break;
        uVar24 = uVar24 - 1 & uVar24;
        bVar26 = uVar24 == 0;
      } while (!bVar26);
    }
    if (bVar26) {
      auVar30[0] = -(cVar7 == -0x80);
      auVar30[1] = -(cVar8 == -0x80);
      auVar30[2] = -(cVar9 == -0x80);
      auVar30[3] = -(cVar10 == -0x80);
      auVar30[4] = -(cVar11 == -0x80);
      auVar30[5] = -(cVar12 == -0x80);
      auVar30[6] = -(cVar13 == -0x80);
      auVar30[7] = -(cVar14 == -0x80);
      auVar30[8] = -(cVar15 == -0x80);
      auVar30[9] = -(cVar16 == -0x80);
      auVar30[10] = -(cVar17 == -0x80);
      auVar30[0xb] = -(cVar18 == -0x80);
      auVar30[0xc] = -(cVar19 == -0x80);
      auVar30[0xd] = -(cVar20 == -0x80);
      auVar30[0xe] = -(cVar21 == -0x80);
      auVar30[0xf] = -(cVar22 == -0x80);
      if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar30 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar30 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar30 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar30 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf])
      {
        if (this->capacity_ <= local_68 + 0x10) {
          __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x953,
                        "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::has_element(const value_type &, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                       );
        }
        uVar25 = uVar25 + local_68 + 0x10 & uVar2;
        bVar26 = true;
        local_68 = local_68 + 0x10;
      }
      else {
        bVar26 = false;
        unaff_BPL = 0;
      }
    }
    else {
      bVar26 = false;
    }
    if (!bVar26) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool has_element(const value_type& elem, size_t hashval) const
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
						                       elem))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
					seq.next();
					assert(seq.getindex() < capacity_ && "full table!");
				}
				return false;
			}